

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O1

int nghttp2_map_remove(nghttp2_map *map,nghttp2_map_key_type key)

{
  char cVar1;
  void *pvVar2;
  nghttp2_map_key_type nVar3;
  ulong uVar4;
  ulong uVar5;
  nghttp2_map_bucket *pnVar6;
  ulong uVar7;
  nghttp2_map_bucket *pnVar8;
  void **ppvVar9;
  uint uVar10;
  
  cVar1 = (char)map->tablelenbits;
  uVar4 = (ulong)((uint)(key * -0x61c88647) >> (-cVar1 & 0x1fU));
  pnVar6 = map->table;
  if (pnVar6[uVar4].data == (void *)0x0) {
    return -0x1f5;
  }
  uVar10 = map->tablelen - 1;
  uVar5 = 0xffffffffffffffff;
  while( true ) {
    pnVar8 = pnVar6 + uVar4;
    uVar5 = uVar5 + 1;
    if (((int)uVar4 - (pnVar8->hash >> (0x20U - cVar1 & 0x1f)) & uVar10) < uVar5) {
      return -0x1f5;
    }
    uVar7 = (ulong)((int)uVar4 + 1U & uVar10);
    if (pnVar8->key == key) break;
    uVar4 = uVar7;
    if (pnVar6[uVar7].data == (void *)0x0) {
      return -0x1f5;
    }
  }
  pnVar8->hash = 0;
  pnVar8->key = 0;
  pnVar8->data = (void *)0x0;
  pnVar6 = map->table;
  if (pnVar6[uVar7].data != (void *)0x0) {
    pnVar8 = pnVar6 + uVar7;
    ppvVar9 = &pnVar6[uVar7].data;
    do {
      if (((int)uVar7 - (pnVar8->hash >> (-(char)map->tablelenbits & 0x1fU)) & map->tablelen - 1) ==
          0) break;
      nVar3 = pnVar8->key;
      pvVar2 = pnVar8->data;
      pnVar6 = pnVar6 + uVar4;
      pnVar6->hash = pnVar8->hash;
      pnVar6->key = nVar3;
      pnVar6->data = pvVar2;
      pnVar8->hash = 0;
      pnVar8->key = 0;
      *ppvVar9 = (void *)0x0;
      uVar5 = (ulong)(map->tablelen - 1 & (int)uVar7 + 1U);
      pnVar6 = map->table;
      pnVar8 = pnVar6 + uVar5;
      ppvVar9 = &pnVar6[uVar5].data;
      uVar4 = uVar7;
      uVar7 = uVar5;
    } while (*ppvVar9 != (void *)0x0);
  }
  map->size = map->size - 1;
  return 0;
}

Assistant:

int nghttp2_map_remove(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits), didx;
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (bkt->key == key) {
      map_bucket_set_data(bkt, 0, 0, NULL);

      didx = idx;
      idx = (idx + 1) & (map->tablelen - 1);

      for (;;) {
        bkt = &map->table[idx];
        if (bkt->data == NULL ||
            distance(map->tablelen, map->tablelenbits, bkt, idx) == 0) {
          break;
        }

        map->table[didx] = *bkt;
        map_bucket_set_data(bkt, 0, 0, NULL);
        didx = idx;

        idx = (idx + 1) & (map->tablelen - 1);
      }

      --map->size;

      return 0;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}